

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

void xmlFAReduceEpsilonTransitions(xmlRegParserCtxtPtr ctxt,int fromnr,int tonr,int counter)

{
  int tonr_00;
  xmlRegStatePtr state;
  xmlRegStatePtr pxVar1;
  xmlRegTrans *pxVar2;
  xmlRegStatePtr target;
  long lVar3;
  xmlRegAtomPtr atom;
  long lVar4;
  int counter_00;
  int count;
  long lVar5;
  
  state = ctxt->states[(uint)fromnr];
  if (((state != (xmlRegStatePtr)0x0) &&
      (pxVar1 = ctxt->states[tonr], pxVar1 != (xmlRegStatePtr)0x0)) &&
     (1 < pxVar1->mark - XML_REGEXP_MARK_START)) {
    pxVar1->mark = XML_REGEXP_MARK_VISITED;
    if (pxVar1->type == XML_REGEXP_FINAL_STATE) {
      state->type = XML_REGEXP_FINAL_STATE;
    }
    if (0 < pxVar1->nbTrans) {
      lVar5 = 0x10;
      lVar4 = 0;
      do {
        pxVar2 = pxVar1->trans;
        tonr_00 = *(int *)((long)pxVar2 + lVar5 + -8);
        lVar3 = (long)tonr_00;
        if (-1 < lVar3) {
          counter_00 = *(int *)((long)pxVar2 + lVar5 + -4);
          if (counter_00 < 0) {
            counter_00 = counter;
          }
          atom = *(xmlRegAtomPtr *)((long)pxVar2 + lVar5 + -0x10);
          if (atom == (xmlRegAtomPtr)0x0) {
            if (tonr_00 != fromnr) {
              count = *(int *)((long)&pxVar2->atom + lVar5);
              if (-1 < count) {
                target = ctxt->states[lVar3];
                atom = (xmlRegAtomPtr)0x0;
                counter_00 = -1;
                goto LAB_0017cf81;
              }
              xmlFAReduceEpsilonTransitions(ctxt,fromnr,tonr_00,counter_00);
            }
          }
          else {
            target = ctxt->states[lVar3];
            count = -1;
LAB_0017cf81:
            xmlRegStateAddTrans(ctxt,state,atom,target,counter_00,count);
          }
        }
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0x18;
      } while (lVar4 < pxVar1->nbTrans);
    }
  }
  return;
}

Assistant:

static void
xmlFAReduceEpsilonTransitions(xmlRegParserCtxtPtr ctxt, int fromnr,
	                      int tonr, int counter) {
    int transnr;
    xmlRegStatePtr from;
    xmlRegStatePtr to;

    from = ctxt->states[fromnr];
    if (from == NULL)
	return;
    to = ctxt->states[tonr];
    if (to == NULL)
	return;
    if ((to->mark == XML_REGEXP_MARK_START) ||
	(to->mark == XML_REGEXP_MARK_VISITED))
	return;

    to->mark = XML_REGEXP_MARK_VISITED;
    if (to->type == XML_REGEXP_FINAL_STATE) {
	from->type = XML_REGEXP_FINAL_STATE;
    }
    for (transnr = 0;transnr < to->nbTrans;transnr++) {
        xmlRegTransPtr t1 = &to->trans[transnr];
        int tcounter;

        if (t1->to < 0)
	    continue;
        if (t1->counter >= 0) {
            /* assert(counter < 0); */
            tcounter = t1->counter;
        } else {
            tcounter = counter;
        }
	if (t1->atom == NULL) {
	    /*
	     * Don't remove counted transitions
	     * Don't loop either
	     */
	    if (t1->to != fromnr) {
		if (t1->count >= 0) {
		    xmlRegStateAddTrans(ctxt, from, NULL, ctxt->states[t1->to],
					-1, t1->count);
		} else {
                    xmlFAReduceEpsilonTransitions(ctxt, fromnr, t1->to,
                                                  tcounter);
		}
	    }
	} else {
            xmlRegStateAddTrans(ctxt, from, t1->atom,
                                ctxt->states[t1->to], tcounter, -1);
	}
    }
}